

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdSocket.cpp
# Opt level: O2

TcpSocket * __thiscall TcpServerImpl::MakeClientConnection(TcpServerImpl *this,int32_t *fSock)

{
  BaseSocket *pBVar1;
  BaseSocket *this_00;
  BaseSocketImpl *pBVar2;
  TcpSocketImpl *this_01;
  TcpServer *pTVar3;
  pointer *__ptr;
  _Head_base<0UL,_BaseSocket_*,_false> local_48;
  _Head_base<0UL,_BaseSocket_*,_false> local_40;
  undefined8 local_38;
  thread local_30;
  TcpSocketImpl *local_28;
  
  std::make_unique<TcpSocket>();
  local_48._M_head_impl = local_40._M_head_impl;
  this_01 = (TcpSocketImpl *)0x0;
  this_00 = (BaseSocket *)
            __dynamic_cast(local_40._M_head_impl,&BaseSocket::typeinfo,&TcpSocket::typeinfo,0);
  pBVar2 = BaseSocket::GetImpl(this_00);
  if (pBVar2 != (BaseSocketImpl *)0x0) {
    this_01 = (TcpSocketImpl *)
              __dynamic_cast(pBVar2,&BaseSocketImpl::typeinfo,&TcpSocketImpl::typeinfo,0);
  }
  (this_01->super_BaseSocketImpl).m_fSock = *fSock;
  LOCK();
  (this_01->super_BaseSocketImpl).m_iShutDownState.super___atomic_base<unsigned_char>._M_i = '\a';
  UNLOCK();
  pBVar1 = (this->super_BaseSocketImpl).m_pBkRef;
  if (pBVar1 == (BaseSocket *)0x0) {
    pTVar3 = (TcpServer *)0x0;
  }
  else {
    pTVar3 = (TcpServer *)__dynamic_cast(pBVar1,&BaseSocket::typeinfo,&TcpServer::typeinfo,0);
  }
  this_01->m_pRefServSocket = pTVar3;
  local_40._M_head_impl = (BaseSocket *)TcpSocketImpl::WriteThread;
  local_38 = 0;
  pBVar2 = BaseSocket::GetImpl(this_00);
  if (pBVar2 == (BaseSocketImpl *)0x0) {
    local_28 = (TcpSocketImpl *)0x0;
  }
  else {
    local_28 = (TcpSocketImpl *)
               __dynamic_cast(pBVar2,&BaseSocketImpl::typeinfo,&TcpSocketImpl::typeinfo,0);
  }
  std::thread::thread<void(TcpSocketImpl::*)(),TcpSocketImpl*,void>
            (&local_30,(type *)&local_40,&local_28);
  std::thread::operator=(&(this_01->super_BaseSocketImpl).m_thWrite,&local_30);
  std::thread::~thread(&local_30);
  (*(this_01->super_BaseSocketImpl)._vptr_BaseSocketImpl[0xe])(this_01,fSock);
  TcpSocketImpl::GetConnectionInfo(this_01);
  std::mutex::lock(&BaseSocketImpl::s_mxClientSocket);
  std::
  deque<std::unique_ptr<BaseSocket,std::default_delete<BaseSocket>>,std::allocator<std::unique_ptr<BaseSocket,std::default_delete<BaseSocket>>>>
  ::emplace_back<std::unique_ptr<BaseSocket,std::default_delete<BaseSocket>>>
            ((deque<std::unique_ptr<BaseSocket,std::default_delete<BaseSocket>>,std::allocator<std::unique_ptr<BaseSocket,std::default_delete<BaseSocket>>>>
              *)&BaseSocketImpl::s_lstClientSocket,
             (unique_ptr<BaseSocket,_std::default_delete<BaseSocket>_> *)&local_48);
  pthread_mutex_unlock((pthread_mutex_t *)&BaseSocketImpl::s_mxClientSocket);
  if (local_48._M_head_impl != (BaseSocket *)0x0) {
    (*(local_48._M_head_impl)->_vptr_BaseSocket[1])();
  }
  return (TcpSocket *)this_00;
}

Assistant:

TcpSocket* TcpServerImpl::MakeClientConnection(const SOCKET& fSock)
{
    unique_ptr<BaseSocket> pTcpSocket = make_unique<TcpSocket>();
    TcpSocket* pTcpSock = dynamic_cast<TcpSocket*>(pTcpSocket.get());
    TcpSocketImpl* pTcpSocketImpl = dynamic_cast<TcpSocketImpl*>(pTcpSock->GetImpl());

    try
    {
        pTcpSocketImpl->m_fSock = fSock;
        pTcpSocketImpl->m_iShutDownState = 7;
        pTcpSocketImpl->m_pRefServSocket = dynamic_cast<TcpServer*>(m_pBkRef);
        pTcpSocketImpl->m_thWrite = thread(&TcpSocketImpl::WriteThread, dynamic_cast<TcpSocketImpl*>(pTcpSock->GetImpl()));

        pTcpSocketImpl->SetSocketOption(fSock);
        pTcpSocketImpl->GetConnectionInfo();
    }

    catch (const int iErrNo)
    {
        pTcpSocketImpl->SetErrorNo(iErrNo);
    }

    lock_guard<mutex> lock(s_mxClientSocket);
    s_lstClientSocket.push_back(move(pTcpSocket));

    return pTcpSock;
}